

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void __thiscall gvr::PointCloud::savePLY(PointCloud *this,char *name,bool all,ply_encoding enc)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int in_ECX;
  size_t __n;
  byte in_DL;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  int __fd;
  char *in_RSI;
  string *psVar4;
  PointCloud *in_RDI;
  int i;
  PLYWriter ply;
  undefined4 in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  string *in_stack_fffffffffffffba8;
  allocator *paVar5;
  PLYWriter *in_stack_fffffffffffffbb0;
  uint local_400;
  allocator local_3f9;
  string local_3f8 [28];
  ply_type in_stack_fffffffffffffc24;
  string *in_stack_fffffffffffffc28;
  PLYWriter *in_stack_fffffffffffffc30;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [408];
  PLYWriter *in_stack_ffffffffffffff08;
  Model *in_stack_ffffffffffffff10;
  
  bVar1 = in_DL & 1;
  PLYWriter::PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  PLYWriter::open((PLYWriter *)(local_290 + 0x30),in_RSI,in_ECX);
  Model::setOriginToPLY(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"vertex",&local_291);
  getVertexCount(in_RDI);
  PLYWriter::addElement
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"x",&local_2b9);
  PLYWriter::addProperty
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"y",&local_2e1);
  PLYWriter::addProperty
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"z",&local_309);
  psVar4 = local_308;
  PLYWriter::addProperty
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  bVar2 = hasScanProp(in_RDI);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"scan_size",&local_331);
    psVar4 = local_330;
    PLYWriter::addProperty
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    if (bVar1 != 0) {
      paVar5 = &local_359;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"scan_error",paVar5);
      PLYWriter::addProperty
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      paVar5 = &local_381;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"scan_conf",paVar5);
      psVar4 = local_380;
      PLYWriter::addProperty
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
    }
  }
  if ((bVar1 != 0) && (bVar2 = hasScanPos(in_RDI), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"sx",&local_3a9);
    PLYWriter::addProperty
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffc30,"sy",(allocator *)&stack0xfffffffffffffc2f);
    PLYWriter::addProperty
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc2f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"sz",&local_3f9);
    psVar4 = local_3f8;
    PLYWriter::addProperty
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  local_400 = 0;
  while( true ) {
    __fd = (int)psVar4;
    uVar3 = getVertexCount(in_RDI);
    __n = (size_t)uVar3;
    if ((int)uVar3 <= (int)local_400) break;
    uVar3 = local_400;
    getVertexComp(in_RDI,local_400,0);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar3,__buf,__n);
    uVar3 = local_400;
    getVertexComp(in_RDI,local_400,1);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar3,__buf_00,__n);
    psVar4 = (string *)(ulong)local_400;
    getVertexComp(in_RDI,local_400,2);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar4,__buf_01,__n);
    bVar2 = hasScanProp(in_RDI);
    if (bVar2) {
      psVar4 = (string *)(ulong)local_400;
      getScanSize(in_RDI,local_400);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar4,__buf_02,__n);
      if (bVar1 != 0) {
        uVar3 = local_400;
        getScanError(in_RDI,local_400);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar3,__buf_03,__n);
        psVar4 = (string *)(ulong)local_400;
        in_stack_fffffffffffffb64 = getScanConf(in_RDI,local_400);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar4,__buf_04,__n);
      }
    }
    if (bVar1 != 0) {
      bVar2 = hasScanPos(in_RDI);
      in_stack_fffffffffffffb60 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb60);
      if (bVar2) {
        uVar3 = local_400;
        getScanPosComp(in_RDI,local_400,0);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar3,__buf_05,__n);
        uVar3 = local_400;
        getScanPosComp(in_RDI,local_400,1);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar3,__buf_06,__n);
        psVar4 = (string *)(ulong)local_400;
        getScanPosComp(in_RDI,local_400,2);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar4,__buf_07,__n);
      }
    }
    local_400 = local_400 + 1;
  }
  PLYWriter::close((PLYWriter *)(local_290 + 0x30),__fd);
  PLYWriter::~PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  return;
}

Assistant:

void PointCloud::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  // define header

  ply.open(name, enc);

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }
  }

  ply.close();
}